

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void clearSelect(sqlite3 *db,Select *p,int bFree)

{
  Select *pSVar1;
  Window *pWVar2;
  Window *pWVar3;
  bool bVar4;
  
  if (p == (Select *)0x0) {
    return;
  }
  bVar4 = bFree == 0;
LAB_001645b1:
  pSVar1 = p->pPrior;
  if (p->pEList != (ExprList *)0x0) {
    exprListDeleteNN(db,p->pEList);
  }
  sqlite3SrcListDelete(db,p->pSrc);
  if (p->pWhere != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,p->pWhere);
  }
  if (p->pGroupBy != (ExprList *)0x0) {
    exprListDeleteNN(db,p->pGroupBy);
  }
  if (p->pHaving != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,p->pHaving);
  }
  if (p->pOrderBy != (ExprList *)0x0) {
    exprListDeleteNN(db,p->pOrderBy);
  }
  if (p->pLimit != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,p->pLimit);
  }
  if (p->pWith != (With *)0x0) {
    sqlite3WithDelete(db,p->pWith);
  }
  pWVar3 = p->pWinDefn;
  while (pWVar3 != (Window *)0x0) {
    pWVar2 = pWVar3->pNextWin;
    sqlite3WindowDelete(db,pWVar3);
    pWVar3 = pWVar2;
  }
  do {
    pWVar3 = p->pWin;
    do {
      if (pWVar3 == (Window *)0x0) {
        if (!bVar4) {
          sqlite3DbNNFreeNN(db,p);
        }
        bVar4 = false;
        p = pSVar1;
        if (pSVar1 == (Select *)0x0) {
          return;
        }
        goto LAB_001645b1;
      }
    } while (pWVar3->ppThis == (Window **)0x0);
    pWVar2 = pWVar3->pNextWin;
    *pWVar3->ppThis = pWVar2;
    if (pWVar2 != (Window *)0x0) {
      pWVar2->ppThis = pWVar3->ppThis;
    }
    pWVar3->ppThis = (Window **)0x0;
  } while( true );
}

Assistant:

static void clearSelect(sqlite3 *db, Select *p, int bFree){
  assert( db!=0 );
  while( p ){
    Select *pPrior = p->pPrior;
    sqlite3ExprListDelete(db, p->pEList);
    sqlite3SrcListDelete(db, p->pSrc);
    sqlite3ExprDelete(db, p->pWhere);
    sqlite3ExprListDelete(db, p->pGroupBy);
    sqlite3ExprDelete(db, p->pHaving);
    sqlite3ExprListDelete(db, p->pOrderBy);
    sqlite3ExprDelete(db, p->pLimit);
    if( OK_IF_ALWAYS_TRUE(p->pWith) ) sqlite3WithDelete(db, p->pWith);
#ifndef SQLITE_OMIT_WINDOWFUNC
    if( OK_IF_ALWAYS_TRUE(p->pWinDefn) ){
      sqlite3WindowListDelete(db, p->pWinDefn);
    }
    while( p->pWin ){
      assert( p->pWin->ppThis==&p->pWin );
      sqlite3WindowUnlinkFromSelect(p->pWin);
    }
#endif
    if( bFree ) sqlite3DbNNFreeNN(db, p);
    p = pPrior;
    bFree = 1;
  }
}